

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

double * __thiscall
google::protobuf::RepeatedField<double>::Get(RepeatedField<double> *this,int index)

{
  LogMessage *pLVar1;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (index < 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x475);
    pLVar1 = internal::LogMessage::operator<<(&local_50,"CHECK failed: (index) >= (0): ");
    internal::LogFinisher::operator=(&local_51,pLVar1);
    internal::LogMessage::~LogMessage(&local_50);
  }
  if (this->current_size_ <= index) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x476);
    pLVar1 = internal::LogMessage::operator<<(&local_50,"CHECK failed: (index) < (current_size_): ")
    ;
    internal::LogFinisher::operator=(&local_51,pLVar1);
    internal::LogMessage::~LogMessage(&local_50);
  }
  return this->rep_->elements + index;
}

Assistant:

inline const Element& RepeatedField<Element>::Get(int index) const {
  GOOGLE_DCHECK_GE(index, 0);
  GOOGLE_DCHECK_LT(index, current_size_);
  return rep_->elements[index];
}